

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

Aig_Man_t * Aig_ManDupNodesAll(Aig_Man_t *p,Vec_Ptr_t *vSet)

{
  Aig_Man_t *p_00;
  char *pcVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *p1;
  Aig_Man_t *pAVar5;
  int iVar6;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar1;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar6);
    pAVar3 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
  }
  for (iVar6 = 0; iVar6 < p->vObjs->nSize; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar6);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar3->field_0x18 & 7) - 7)) {
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      p1 = Aig_ObjChild1Copy(pAVar3);
      pAVar4 = Aig_And(p_00,pAVar4,p1);
      (pAVar3->field_5).pData = pAVar4;
    }
  }
  for (iVar6 = 0; iVar6 < vSet->nSize; iVar6 = iVar6 + 1) {
    pvVar2 = Vec_PtrEntry(vSet,iVar6);
    Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                         ((ulong)((uint)pvVar2 & 1) ^
                         *(ulong *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x28)));
  }
  for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,p->nTruePos + iVar6);
    pAVar4 = Aig_ObjChild0Copy(pAVar3);
    pAVar4 = Aig_ObjCreateCo(p_00,pAVar4);
    (pAVar3->field_5).pData = pAVar4;
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  Aig_ManSeqCleanup(p_00);
  pAVar5 = Aig_ManDupSimpleDfs(p_00);
  Aig_ManStop(p_00);
  return pAVar5;
}

Assistant:

Aig_Man_t * Aig_ManDupNodesAll( Aig_Man_t * p, Vec_Ptr_t * vSet )
{
    Aig_Man_t * pNew, * pCopy;
    Aig_Obj_t * pObj;
    int i;
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
//    Saig_ManForEachPo( p, pObj, i )
//        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSet, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_NotCond((Aig_Obj_t *)Aig_Regular(pObj)->pData, Aig_IsComplement(pObj)) );
    Saig_ManForEachLi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p) );
    // cleanup and return a copy
    Aig_ManSeqCleanup( pNew );
    pCopy = Aig_ManDupSimpleDfs( pNew );
    Aig_ManStop( pNew );
    return pCopy;
}